

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls-server.c
# Opt level: O0

int lws_context_init_server_ssl(lws_context_creation_info *info,lws_vhost *vhost)

{
  lws_context *plVar1;
  lws *wsi;
  int iVar2;
  lws_usec_t lVar3;
  char *pcVar4;
  lws_a *plwsa;
  lws_context *context;
  lws_vhost *vhost_local;
  lws_context_creation_info *info_local;
  
  plVar1 = vhost->context;
  wsi = vhost->context->pt[0].fake_wsi;
  memset(wsi,0,0x20);
  (wsi->a).context = vhost->context;
  if ((info->options & 0x1000) != 0x1000) {
    (vhost->tls).use_ssl = 0;
    return 0;
  }
  if ((info->ssl_cert_filepath != (char *)0x0) || (info->server_ssl_cert_mem != (void *)0x0)) {
    vhost->options = vhost->options | 0x1000000;
  }
  if (info->port != -1) {
    (vhost->tls).use_ssl = (uint)((vhost->options & 0x1000000) == 0x1000000);
    if (((vhost->tls).use_ssl != 0) && (info->ssl_cipher_list != (char *)0x0)) {
      _lws_log(4," SSL ciphers: \'%s\'\n",info->ssl_cipher_list);
    }
    pcVar4 = "non-";
    if ((vhost->tls).use_ssl != 0) {
      pcVar4 = "";
    }
    _lws_log(4," Vhost \'%s\' using %sTLS mode\n",vhost->name,pcVar4);
  }
  (wsi->a).vhost = vhost;
  if ((info->options & 0x1008) == 0x1008) {
    (vhost->tls).allow_non_ssl_on_ssl_port = 1;
  }
  if ((vhost->tls).use_ssl != 0) {
    iVar2 = lws_tls_server_vhost_backend_init(info,vhost,wsi);
    if (iVar2 != 0) {
      return -1;
    }
    lws_tls_server_client_cert_verify_config(vhost);
    iVar2 = (*vhost->protocols->callback)
                      (wsi,LWS_CALLBACK_OPENSSL_LOAD_EXTRA_SERVER_VERIFY_CERTS,(vhost->tls).ssl_ctx,
                       vhost,0);
    if (iVar2 != 0) {
      return -1;
    }
  }
  if ((vhost->tls).use_ssl != 0) {
    lws_context_init_alpn(vhost);
  }
  plVar1->pt[0].sul_tls.cb = lws_sul_tls_cb;
  lVar3 = lws_now_usecs();
  plVar1->pt[0].sul_tls.us = lVar3 + 86400000000;
  __lws_sul_insert(plVar1->pt[0].pt_sul_owner,&plVar1->pt[0].sul_tls);
  return 0;
}

Assistant:

int
lws_context_init_server_ssl(const struct lws_context_creation_info *info,
			    struct lws_vhost *vhost)
{
	struct lws_context *context = vhost->context;
	lws_fakewsi_def_plwsa(&vhost->context->pt[0]);

	lws_fakewsi_prep_plwsa_ctx(vhost->context);

	if (!lws_check_opt(info->options,
			   LWS_SERVER_OPTION_DO_SSL_GLOBAL_INIT)) {
		vhost->tls.use_ssl = 0;

		return 0;
	}

	/*
	 * If he is giving a server cert, take it as a sign he wants to use
	 * it on this vhost.  User code can leave the cert filepath NULL and
	 * set the LWS_SERVER_OPTION_CREATE_VHOST_SSL_CTX option itself, in
	 * which case he's expected to set up the cert himself at
	 * LWS_CALLBACK_OPENSSL_LOAD_EXTRA_SERVER_VERIFY_CERTS, which
	 * provides the vhost SSL_CTX * in the user parameter.
	 */
	if (info->ssl_cert_filepath || info->server_ssl_cert_mem)
		vhost->options |= LWS_SERVER_OPTION_CREATE_VHOST_SSL_CTX;

	if (info->port != CONTEXT_PORT_NO_LISTEN) {

		vhost->tls.use_ssl = lws_check_opt(vhost->options,
					LWS_SERVER_OPTION_CREATE_VHOST_SSL_CTX);

		if (vhost->tls.use_ssl && info->ssl_cipher_list)
			lwsl_notice(" SSL ciphers: '%s'\n",
						info->ssl_cipher_list);

		lwsl_notice(" Vhost '%s' using %sTLS mode\n",
			    vhost->name, vhost->tls.use_ssl ? "" : "non-");
	}

	/*
	 * give him a fake wsi with context + vhost set, so he can use
	 * lws_get_context() in the callback
	 */
	plwsa->vhost = vhost; /* not a real bound wsi */

	/*
	 * as a server, if we are requiring clients to identify themselves
	 * then set the backend up for it
	 */
	if (lws_check_opt(info->options,
			  LWS_SERVER_OPTION_ALLOW_NON_SSL_ON_SSL_PORT))
		/* Normally SSL listener rejects non-ssl, optionally allow */
		vhost->tls.allow_non_ssl_on_ssl_port = 1;

	/*
	 * give user code a chance to load certs into the server
	 * allowing it to verify incoming client certs
	 */
	if (vhost->tls.use_ssl) {
		if (lws_tls_server_vhost_backend_init(info, vhost, (struct lws *)plwsa))
			return -1;

		lws_tls_server_client_cert_verify_config(vhost);

		if (vhost->protocols[0].callback((struct lws *)plwsa,
			    LWS_CALLBACK_OPENSSL_LOAD_EXTRA_SERVER_VERIFY_CERTS,
			    vhost->tls.ssl_ctx, vhost, 0))
			return -1;
	}

	if (vhost->tls.use_ssl)
		lws_context_init_alpn(vhost);

	/* check certs once a day */

	context->pt[0].sul_tls.cb = lws_sul_tls_cb;
	__lws_sul_insert_us(&context->pt[0].pt_sul_owner[LWSSULLI_MISS_IF_SUSPENDED],
			    &context->pt[0].sul_tls,
			    (lws_usec_t)24 * 3600 * LWS_US_PER_SEC);

	return 0;
}